

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvrp-instance-modifier.c
# Opt level: O1

Instance * process_instance(Instance *__return_storage_ptr__,Instance *instance,AppCtx *ctx)

{
  int iVar1;
  double dVar2;
  
  instance_copy(__return_storage_ptr__,instance,true,true);
  dVar2 = ctx->cap_scale_factor;
  if ((dVar2 != 1.0) || (NAN(dVar2))) {
    __return_storage_ptr__->vehicle_cap = __return_storage_ptr__->vehicle_cap * dVar2;
    dVar2 = ceil((double)__return_storage_ptr__->num_vehicles / dVar2);
    __return_storage_ptr__->num_vehicles = (int)dVar2;
  }
  iVar1 = 1;
  if (1 < __return_storage_ptr__->num_vehicles) {
    iVar1 = __return_storage_ptr__->num_vehicles;
  }
  __return_storage_ptr__->num_vehicles = iVar1;
  return __return_storage_ptr__;
}

Assistant:

Instance process_instance(const Instance *instance, const AppCtx *ctx) {
    Instance result = instance_copy(instance, true, true);

    if (ctx->cap_scale_factor != 1.0) {
        result.vehicle_cap = result.vehicle_cap * ctx->cap_scale_factor;
        result.num_vehicles = (int32_t)(ceil((double)result.num_vehicles /
                                             ctx->cap_scale_factor));
    }

    result.num_vehicles = MAX(1, result.num_vehicles);
    return result;
}